

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Console::Prompt::Private::promptMoveRight(Private *this)

{
  if (this->caretPos < (ulong)((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2)
     ) {
    moveCursorPosition(this,((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2)
                            + this->caretPos,1);
    this->caretPos = this->caretPos + 1;
  }
  return;
}

Assistant:

usize size() const {return _end.item - _begin.item;}